

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this,void **vtt)

{
  void **vtt_local;
  IfcDimensionCurveTerminator *this_local;
  
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem = *vtt;
  *(void **)(&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
              super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcTerminatorSymbol).
                                super_IfcAnnotationSymbolOccurrence.super_IfcAnnotationOccurrence.
                                super_IfcStyledItem + -0x18)) = vtt[0x21];
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x22];
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = vtt[0x23];
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x80 = vtt[0x24];
  *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
             super_IfcAnnotationOccurrence.field_0x90 = vtt[0x25];
  *(void **)&(this->super_IfcTerminatorSymbol).field_0xa8 = vtt[0x26];
  std::__cxx11::string::~string((string *)&(this->super_IfcTerminatorSymbol).field_0xb8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator,_1UL> *)
             &(this->super_IfcTerminatorSymbol).field_0xa8,vtt + 0x1f);
  IfcTerminatorSymbol::~IfcTerminatorSymbol(&this->super_IfcTerminatorSymbol,vtt + 1);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}